

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O1

void __thiscall tst_helpers_map::sequenceTypes(tst_helpers_map *this)

{
  char16_t **ppcVar1;
  QSharedData *pQVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  Data *pDVar5;
  int *piVar6;
  PromiseResolver<QString> PVar7;
  pointer piVar8;
  QString *data;
  QString *pQVar9;
  ulong uVar10;
  long lVar11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  PromiseResolver<QString> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_150;
  QArrayDataPointer<QString> local_148;
  QArrayDataPointer<QString> local_128;
  PromiseResolver<QString> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_> local_100;
  allocator_type local_f1;
  vector<int,_std::allocator<int>_> local_f0;
  QArrayDataPointer<QString> local_d8;
  PromiseType p;
  long local_b0;
  vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_> promises;
  _List_node_base *local_80 [2];
  pointer local_70;
  _List_node_base *local_68;
  _List_node_base *p_Stack_60;
  pointer local_58;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_50;
  QString local_48;
  
  anon_unknown.dwarf_5ab7e::SequenceTester<QList<int>_>::exec();
  anon_unknown.dwarf_5ab7e::SequenceTester<QList<int>_>::exec();
  local_128.d = (Data *)0x2b0000002a;
  local_128.ptr = (QString *)CONCAT44(local_128.ptr._4_4_,0x2c);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_128;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_f0,__l,(allocator_type *)&local_150);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var3 = (_List_node_base *)
                local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; p_Var3 != (_List_node_base *)&local_f0;
      p_Var3 = (((_List_base<int,_std::allocator<int>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next) {
    local_148.d = (Data *)&PTR__QPromiseBase_0012bac0;
    pQVar9 = (QString *)operator_new(0x68);
    (pQVar9->d).d = (Data *)0x0;
    (pQVar9->d).ptr = (char16_t *)0x0;
    pQVar9[3].d.ptr = (char16_t *)0x0;
    pQVar9[3].d.size = 0;
    pQVar9[2].d.size = 0;
    pQVar9[3].d.d = (Data *)0x0;
    pQVar9[2].d.d = (Data *)0x0;
    pQVar9[2].d.ptr = (char16_t *)0x0;
    pQVar9[1].d.ptr = (char16_t *)0x0;
    pQVar9[1].d.size = 0;
    (pQVar9->d).size = 0;
    pQVar9[1].d.d = (Data *)0x0;
    pQVar9[4].d.d = (Data *)0x0;
    (pQVar9->d).d = (Data *)&PTR__PromiseDataBase_0012bb48;
    QReadWriteLock::QReadWriteLock((QReadWriteLock *)&(pQVar9->d).size,0);
    *(undefined1 *)&pQVar9[1].d.d = 0;
    pQVar9[1].d.ptr = (char16_t *)0x0;
    pQVar9[1].d.size = 0;
    pQVar9[2].d.d = (Data *)0x0;
    pQVar9[2].d.ptr = (char16_t *)0x0;
    pQVar9[2].d.size = 0;
    pQVar9[3].d.d = (Data *)0x0;
    pQVar9[3].d.ptr = (char16_t *)0x0;
    (pQVar9->d).d = (Data *)&PTR__PromiseData_0012bae0;
    pQVar9[3].d.size = 0;
    pQVar9[4].d.d = (Data *)0x0;
    LOCK();
    ppcVar1 = &(pQVar9->d).ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    UNLOCK();
    if (pQVar9 != (QString *)0x0) {
      LOCK();
      ppcVar1 = &(pQVar9->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
      UNLOCK();
    }
    local_d8.d = (Data *)&PTR__QPromiseBase_0012ba78;
    local_148.ptr = pQVar9;
    local_d8.ptr = pQVar9;
    QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
              (&resolver,(QPromise<QString> *)&local_d8);
    local_d8.d = (Data *)&PTR__QPromiseBase_0012bac0;
    if (local_d8.ptr != (QString *)0x0) {
      LOCK();
      ppcVar1 = &((local_d8.ptr)->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
      UNLOCK();
      if ((*(int *)ppcVar1 == 0) && (local_d8.ptr != (QString *)0x0)) {
        (*(code *)((((local_d8.ptr)->d).d)->super_QArrayData).alloc)();
      }
    }
    PVar7.m_d.d = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    resolver_1 = resolver;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    QString::number((int)&local_48,*(int *)&p_Var3[1]._M_next + 1);
    QtPromisePrivate::PromiseResolver<QString>::resolve<QString>(&resolver_1,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    if (PVar7.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar7.m_d.d == 0) {
        operator_delete((void *)PVar7.m_d.d,0x10);
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver.m_d.d,0x10);
      }
    }
    local_148.d = (Data *)&PTR__QPromiseBase_0012ba78;
    std::vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>::
    emplace_back<QtPromise::QPromise<QString>>
              ((vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>> *)
               &promises,(QPromise<QString> *)&local_148);
    local_148.d = (Data *)&PTR__QPromiseBase_0012bac0;
    if (local_148.ptr != (QString *)0x0) {
      LOCK();
      ppcVar1 = &((local_148.ptr)->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
      UNLOCK();
      if ((*(int *)ppcVar1 == 0) && (local_148.ptr != (QString *)0x0)) {
        (*(code *)((((local_148.ptr)->d).d)->super_QArrayData).alloc)();
      }
    }
  }
  QtPromise::all<QString,_std::vector,_std::allocator<QtPromise::QPromise<QString>_>_>
            ((QtPromise *)&p,&promises);
  std::vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>::~vector
            (&promises);
  p_Var3 = (_List_node_base *)
           local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  while (p_Var3 != (_List_node_base *)&local_f0) {
    p_Var4 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var4;
  }
  local_148.d = (Data *)0x0;
  local_148.ptr = (QString *)0x0;
  local_148.size = 0;
  waitForValue<QList<QString>>((QList<QString> *)&local_d8,&p,(QList<QString> *)&local_148);
  QVar12.m_data = (storage_type *)0x2;
  QVar12.m_size = (qsizetype)&local_f0;
  QString::fromUtf8(QVar12);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  QVar13.m_data = (storage_type *)0x2;
  QVar13.m_size = (qsizetype)&local_f0;
  QString::fromUtf8(QVar13);
  local_80[0] = (_List_node_base *)
                local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_80[1] = (_List_node_base *)
                local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_70 = (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  QVar14.m_data = (storage_type *)0x2;
  QVar14.m_size = (qsizetype)&local_f0;
  QString::fromUtf8(QVar14);
  local_68 = (_List_node_base *)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  p_Stack_60 = (_List_node_base *)
               local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_58 = (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  local_128.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_128,0x18,8,3,KeepSize);
  local_128.size = 0;
  uVar10 = 0xffffffffffffffe8;
  do {
    pDVar5 = *(Data **)((long)local_80 + uVar10);
    local_128.ptr[local_128.size].d.d = pDVar5;
    local_128.ptr[local_128.size].d.ptr = *(char16_t **)((long)local_80 + uVar10 + 8);
    local_128.ptr[local_128.size].d.size = *(qsizetype *)((long)&local_70 + uVar10);
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128.size = local_128.size + 1;
    uVar10 = uVar10 + 0x18;
  } while (uVar10 < 0x30);
  QTest::_q_compareSequence<QList<QString>::const_iterator,QList<QString>::const_iterator>
            ((const_iterator)local_d8.ptr,local_d8.ptr + local_d8.size,(const_iterator)local_128.ptr
             ,local_128.ptr + local_128.size,"waitForValue(p, QVector<QString>{})",
             "(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x2c);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_128);
  lVar11 = 0x30;
  do {
    piVar6 = *(int **)((long)&promises.
                              super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&promises.
                            super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11),2,8);
      }
    }
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_148);
  local_50.d = (Data *)&PTR__QPromiseBase_0012b670;
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0012b670;
  if (p.super_QPromiseBase<QList<QString>_>.m_d.d != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar2 = &((p.super_QPromiseBase<QList<QString>_>.m_d.d)->
              super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<QString>_>.m_d.d != (PromiseData<QList<QString>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<QString>_>.m_d.d)->
        super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase = (_func_int **)0x2b0000002a;
  p.super_QPromiseBase<QList<QString>_>.m_d.d._0_4_ = 0x2c;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&p;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_00,&local_f1);
  piVar8 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var3 = (_List_node_base *)
                local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; p_Var3 != (_List_node_base *)piVar8;
      p_Var3 = (_List_node_base *)((long)&p_Var3->_M_next + 4)) {
    local_128.d = (Data *)&PTR__QPromiseBase_0012bac0;
    pQVar9 = (QString *)operator_new(0x68);
    (pQVar9->d).d = (Data *)0x0;
    (pQVar9->d).ptr = (char16_t *)0x0;
    pQVar9[3].d.ptr = (char16_t *)0x0;
    pQVar9[3].d.size = 0;
    pQVar9[2].d.size = 0;
    pQVar9[3].d.d = (Data *)0x0;
    pQVar9[2].d.d = (Data *)0x0;
    pQVar9[2].d.ptr = (char16_t *)0x0;
    pQVar9[1].d.ptr = (char16_t *)0x0;
    pQVar9[1].d.size = 0;
    (pQVar9->d).size = 0;
    pQVar9[1].d.d = (Data *)0x0;
    pQVar9[4].d.d = (Data *)0x0;
    (pQVar9->d).d = (Data *)&PTR__PromiseDataBase_0012bb48;
    QReadWriteLock::QReadWriteLock((QReadWriteLock *)&(pQVar9->d).size,0);
    *(undefined1 *)&pQVar9[1].d.d = 0;
    pQVar9[1].d.ptr = (char16_t *)0x0;
    pQVar9[1].d.size = 0;
    pQVar9[2].d.d = (Data *)0x0;
    pQVar9[2].d.ptr = (char16_t *)0x0;
    pQVar9[2].d.size = 0;
    pQVar9[3].d.d = (Data *)0x0;
    pQVar9[3].d.ptr = (char16_t *)0x0;
    (pQVar9->d).d = (Data *)&PTR__PromiseData_0012bae0;
    pQVar9[3].d.size = 0;
    pQVar9[4].d.d = (Data *)0x0;
    LOCK();
    ppcVar1 = &(pQVar9->d).ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    UNLOCK();
    if (pQVar9 != (QString *)0x0) {
      LOCK();
      ppcVar1 = &(pQVar9->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
      UNLOCK();
    }
    local_148.d = (Data *)&PTR__QPromiseBase_0012ba78;
    local_148.ptr = pQVar9;
    local_128.ptr = pQVar9;
    QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
              (&resolver_1,(QPromise<QString> *)&local_148);
    local_148.d = (Data *)&PTR__QPromiseBase_0012bac0;
    if (local_148.ptr != (QString *)0x0) {
      LOCK();
      ppcVar1 = &((local_148.ptr)->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
      UNLOCK();
      if ((*(int *)ppcVar1 == 0) && (local_148.ptr != (QString *)0x0)) {
        (*(code *)((((local_148.ptr)->d).d)->super_QArrayData).alloc)();
      }
    }
    PVar7.m_d.d = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_150 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    QString::number((int)&local_d8,*(int *)&p_Var3->_M_next + 1);
    QtPromisePrivate::PromiseResolver<QString>::resolve<QString>
              ((PromiseResolver<QString> *)&local_150,(QString *)&local_d8);
    if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d)->super_QArrayData,2,8);
      }
    }
    if (PVar7.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar7.m_d.d == 0) {
        operator_delete((void *)PVar7.m_d.d,0x10);
      }
    }
    if (local_150.d != (Data *)0x0) {
      LOCK();
      ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_150.d != (Data *)0x0)) {
        operator_delete(local_150.d,0x10);
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    local_128.d = (Data *)&PTR__QPromiseBase_0012ba78;
    std::vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>::
    emplace_back<QtPromise::QPromise<QString>>
              ((vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>> *)
               &promises,(QPromise<QString> *)&local_128);
    local_128.d = (Data *)&PTR__QPromiseBase_0012bac0;
    if (local_128.ptr != (QString *)0x0) {
      LOCK();
      ppcVar1 = &((local_128.ptr)->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
      UNLOCK();
      if ((*(int *)ppcVar1 == 0) && (local_128.ptr != (QString *)0x0)) {
        (*(code *)((((local_128.ptr)->d).d)->super_QArrayData).alloc)();
      }
    }
  }
  QtPromise::all<QString,_std::vector,_std::allocator<QtPromise::QPromise<QString>_>_>
            ((QtPromise *)&resolver,&promises);
  std::vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>::~vector
            (&promises);
  if ((_List_node_base *)
      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (_List_node_base *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_128.d = (Data *)0x0;
  local_128.ptr = (QString *)0x0;
  local_128.size = 0;
  waitForValue<QList<QString>>
            ((QList<QString> *)&local_148,(QPromise<QList<QString>_> *)&resolver,
             (QList<QString> *)&local_128);
  QVar15.m_data = (storage_type *)0x2;
  QVar15.m_size = (qsizetype)&local_f0;
  QString::fromUtf8(QVar15);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  QVar16.m_data = (storage_type *)0x2;
  QVar16.m_size = (qsizetype)&local_f0;
  QString::fromUtf8(QVar16);
  local_80[0] = (_List_node_base *)
                local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_80[1] = (_List_node_base *)
                local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_70 = (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  QVar17.m_data = (storage_type *)0x2;
  QVar17.m_size = (qsizetype)&local_f0;
  QString::fromUtf8(QVar17);
  local_68 = (_List_node_base *)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  p_Stack_60 = (_List_node_base *)
               local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_58 = (pointer)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  p.super_QPromiseBase<QList<QString>_>.m_d.d =
       (PromiseData<QList<QString>_> *)QArrayData::allocate((QArrayData **)&p,0x18,8,3,KeepSize);
  local_b0 = 0;
  uVar10 = 0xffffffffffffffe8;
  do {
    pDVar5 = *(Data **)((long)local_80 + uVar10);
    (((QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_b0 * 0x18))->d).d =
         pDVar5;
    (((QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_b0 * 0x18))->d).ptr =
         *(char16_t **)((long)local_80 + uVar10 + 8);
    (((QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_b0 * 0x18))->d).size =
         *(qsizetype *)((long)&local_70 + uVar10);
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b0 = local_b0 + 1;
    uVar10 = uVar10 + 0x18;
  } while (uVar10 < 0x30);
  QTest::_q_compareSequence<QList<QString>::const_iterator,QList<QString>::const_iterator>
            ((const_iterator)local_148.ptr,local_148.ptr + local_148.size,
             (const_iterator)p.super_QPromiseBase<QList<QString>_>.m_d.d,
             (QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_b0 * 0x18),
             "waitForValue(p, QVector<QString>{})","(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x2c);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&p);
  lVar11 = 0x30;
  do {
    piVar6 = *(int **)((long)&promises.
                              super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&promises.
                            super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11),2,8);
      }
    }
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_148);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_128);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)local_50.d;
  if (local_100.d != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar2 = &((local_100.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_100.d != (PromiseData<QList<QString>_> *)0x0)
       ) {
      (*((local_100.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_map::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}